

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartThreadIM483Ix(IM483I *pIM483I)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *pCriticalSection;
  THREAD_IDENTIFIER *pThreadId;
  
  pCriticalSection = IM483ICS;
  pThreadId = IM483IThreadId;
  lVar2 = 0;
  do {
    if (*(IM483I **)((long)addrsIM483I + lVar2 * 2) == pIM483I) {
      *(undefined4 *)((long)resIM483I + lVar2) = 1;
      *(undefined4 *)((long)bExitIM483I + lVar2) = 0;
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(IM483IThread,pIM483I,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadIM483Ix(IM483I* pIM483I)
{
	int id = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resIM483I[id] = EXIT_FAILURE;
	bExitIM483I[id] = FALSE;
	InitCriticalSection(&IM483ICS[id]);
	return CreateDefaultThread(IM483IThread, (void*)pIM483I, &IM483IThreadId[id]);
}